

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveFromArena_Test::TestBody
          (MovableMessageTest_MoveFromArena_Test *this)

{
  TestAllTypes *message;
  ulong uVar1;
  char *message_00;
  TestAllTypes_NestedMessage *nested;
  Arena arena;
  TestAllTypes message2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_420;
  AssertHelper local_418;
  internal local_410 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  TestAllTypes_NestedMessage *local_400;
  ThreadSafeArena local_3f8;
  TestAllTypes local_350;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_3f8);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  local_400 = (message->field_0)._impl_.optional_nested_message_;
  if (local_400 == (TestAllTypes_NestedMessage *)0x0) {
    local_400 = (TestAllTypes_NestedMessage *)
                &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  if (&local_350 != message) {
    if ((local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(ulong *)(local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                     0xfffffffffffffffe);
    }
    uVar1 = (message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar1 & 1) != 0) {
      uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
    }
    if (local_350.super_Message.super_MessageLite._internal_metadata_.ptr_ == uVar1) {
      proto2_unittest::TestAllTypes::InternalSwap(&local_350,message);
    }
    else {
      proto2_unittest::TestAllTypes::CopyFrom(&local_350,message);
    }
  }
  if (local_350.field_0._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    local_350.field_0._impl_.optional_nested_message_ =
         (TestAllTypes_NestedMessage *)
         &proto2_unittest::_TestAllTypes_NestedMessage_default_instance_;
  }
  local_420._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_350.field_0._impl_.optional_nested_message_;
  testing::internal::
  CmpHelperNE<proto2_unittest::TestAllTypes_NestedMessage_const*,proto2_unittest::TestAllTypes_NestedMessage_const*>
            (local_410,"nested","&message2.optional_nested_message()",&local_400,
             (TestAllTypes_NestedMessage **)&local_420);
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_420);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = anon_var_dwarf_a22956 + 5;
    }
    else {
      message_00 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/move_unittest.cc"
               ,0x70,message_00);
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    if ((TestAllTypes_NestedMessage *)local_420._M_head_impl != (TestAllTypes_NestedMessage *)0x0) {
      (**(code **)(*(long *)local_420._M_head_impl + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_350);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_3f8);
  return;
}

Assistant:

TEST(MovableMessageTest, MoveFromArena) {
  Arena arena;

  auto* message1_on_arena =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena);
  TestUtil::SetAllFields(message1_on_arena);
  const auto* nested = &message1_on_arena->optional_nested_message();

  proto2_unittest::TestAllTypes message2;

  // Moving from a message on the arena should lead to a copy.
  message2 = std::move(*message1_on_arena);
  EXPECT_NE(nested, &message2.optional_nested_message());
  TestUtil::ExpectAllFieldsSet(*message1_on_arena);
  TestUtil::ExpectAllFieldsSet(message2);
}